

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

string * __thiscall
iutest::PrintToStrings<int,int,int,int,int,int>
          (string *__return_storage_ptr__,iutest *this,char *separate,int *v,int args,int args_1,
          int args_2,int args_3,int args_4)

{
  int in_stack_fffffffffffffe40;
  undefined4 local_1bc;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  local_1bc = SUB84(v,0);
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  std::ostream::operator<<(local_1b8 + 0x10,*(int *)separate);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  PrintToStrings<int,int,int,int,int>
            ((string *)local_1b8,this,(char *)&local_1bc,(int *)(ulong)(uint)args,args_1,args_2,
             args_3,in_stack_fffffffffffffe40);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b8._0_8_);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string PrintToStrings(const char* separate, const T& v, Args... args)
{
    ::std::string str = PrintToString(v);
    str += separate;
    str += PrintToStrings(separate, args...);
    return str;
}